

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

int cvui::internal::inputUpdateCursor
              (int theWidth,String *theContent,double theFontScale,bool theFocused)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  iVar3 = gLastInputKeyPressed;
  if (gLastInputKeyPressed == -1 || !theFocused) {
    return -1;
  }
  uVar7 = theWidth / (int)(theFontScale * 16.0);
  gLastInputKeyPressed = 0xffffffff;
  if (iVar3 - 0x20U < 0x5f) {
    iVar2 = (int)theContent->_M_string_length;
    iVar4 = DAT_001257d0 + DAT_001257c8;
    if (iVar2 <= (int)(DAT_001257d0 + DAT_001257c8)) {
      iVar4 = iVar2;
    }
    std::__cxx11::string::insert((ulong)theContent,(long)iVar4,'\x01');
    uVar6 = DAT_001257d0;
    if ((int)uVar7 <= (int)DAT_001257d0) {
      uVar6 = DAT_001257c8;
    }
    (&DAT_001257c8)[(ulong)((int)DAT_001257d0 < (int)uVar7) * 2] = uVar6 + 1;
  }
  if (iVar3 == 0x270000) {
    if ((ulong)(long)(int)DAT_001257d0 < theContent->_M_string_length) {
      DAT_001257d0 = DAT_001257d0 + 1;
    }
    if ((int)uVar7 < (int)DAT_001257d0) {
      DAT_001257d0 = uVar7;
    }
    if (DAT_001257d0 != uVar7) {
      return 0x270000;
    }
    if ((int)(~DAT_001257c8 + (int)theContent->_M_string_length) < (int)uVar7) {
      return 0x270000;
    }
    DAT_001257c8 = DAT_001257c8 + 1;
    uVar7 = DAT_001257d0;
    goto LAB_00106a3a;
  }
  if (iVar3 == 0x250000) {
    if (0 < (int)DAT_001257d0) {
      DAT_001257d0 = DAT_001257d0 - 1;
      return 0x250000;
    }
    uVar7 = 1;
    if (1 < (int)DAT_001257c8) {
      uVar7 = DAT_001257c8;
    }
    DAT_001257c8 = uVar7 - 1;
    DAT_001257d0 = 0;
    return 0x250000;
  }
  if ((iVar3 != 8) || ((int)DAT_001257d0 < 1 || theContent->_M_string_length == 0)) {
    if ((iVar3 == 0x2e0000) &&
       ((-1 < (int)DAT_001257d0 && ((ulong)DAT_001257d0 < theContent->_M_string_length)))) {
      std::__cxx11::string::erase((ulong)theContent,(ulong)DAT_001257d0);
      return 0x2e0000;
    }
    if (iVar3 != 0x230000) {
      if (iVar3 != 0x240000) {
        return iVar3;
      }
      DAT_001257c8 = 0;
      DAT_001257d0 = 0;
      return 0x240000;
    }
    uVar6 = (uint)theContent->_M_string_length;
    DAT_001257d0 = uVar7;
    if ((int)uVar6 < (int)uVar7) {
      DAT_001257d0 = uVar6;
    }
    if ((int)(uVar6 - uVar7) < 1) {
      DAT_001257c8 = 0;
      return 0x230000;
    }
    DAT_001257c8 = uVar6 - uVar7;
    return 0x230000;
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)theContent);
  std::__cxx11::string::substr((ulong)&local_68,(ulong)theContent);
  uVar8 = 0xf;
  if (local_48 != local_38) {
    uVar8 = local_38[0];
  }
  if (uVar8 < (ulong)(local_60 + local_40)) {
    uVar8 = 0xf;
    if (local_68 != local_58) {
      uVar8 = local_58[0];
    }
    if (uVar8 < (ulong)(local_60 + local_40)) goto LAB_00106845;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
  }
  else {
LAB_00106845:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
  }
  local_88 = &local_78;
  plVar1 = puVar5 + 2;
  if ((long *)*puVar5 == plVar1) {
    local_78 = *plVar1;
    uStack_70 = puVar5[3];
  }
  else {
    local_78 = *plVar1;
    local_88 = (long *)*puVar5;
  }
  local_80 = puVar5[1];
  *puVar5 = plVar1;
  puVar5[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::operator=((string *)theContent,(string *)&local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  uVar7 = 1;
  if (1 < (int)DAT_001257d0) {
    uVar7 = DAT_001257d0;
  }
LAB_00106a3a:
  DAT_001257d0 = uVar7 - 1;
  return iVar3;
}

Assistant:

int inputUpdateCursor(int theWidth, cv::String& theContent, double theFontScale, bool theFocused) {
		if (!theFocused || internal::gLastInputKeyPressed == -1) {
            return -1;
        }

		int key = internal::gLastInputKeyPressed;
        int aScreenCharSize = render::getScreenCharWidth(theFontScale);
        int aCharsFitWidth = (int)(theWidth / aScreenCharSize);

        internal::gLastInputKeyPressed = -1;

		if (key >= 32 && key <= 126) {
            theContent.insert(std::min(gInput.contentStartIndex + gInput.cursorIndex, (int)theContent.length()), 1, (char)key);

            if (gInput.cursorIndex < aCharsFitWidth) {
                gInput.cursorIndex++;
            } else {
                gInput.contentStartIndex++;
            }
        }

		if (key == KEY_BACKSPACE && theContent.length() && gInput.cursorIndex > 0) {
			int indexChatToBeRemoved = gInput.cursorIndex - 1;
			theContent = theContent.substr(0, indexChatToBeRemoved) + theContent.substr(indexChatToBeRemoved + 1, theContent.length());
			
            gInput.cursorIndex--;

            if (gInput.cursorIndex < 0) {
                gInput.cursorIndex = 0;
            }
		} else if (key == KEY_ARROW_RIGHT) {
            if (gInput.cursorIndex < theContent.length()) {
                gInput.cursorIndex++;
            }

            int aRemainingContentChars = (int)theContent.length() - gInput.contentStartIndex - 1;

            if (gInput.cursorIndex > aCharsFitWidth) {
                gInput.cursorIndex = aCharsFitWidth;
            }

            if (gInput.cursorIndex == aCharsFitWidth && aRemainingContentChars >= aCharsFitWidth) {
                gInput.contentStartIndex++;
                gInput.cursorIndex--;
            }
        } else if (key == KEY_ARROW_LEFT) {
            gInput.cursorIndex--;

            if (gInput.cursorIndex < 0) {
                gInput.cursorIndex = 0;
                gInput.contentStartIndex--;
                gInput.contentStartIndex = std::max(gInput.contentStartIndex, 0);
            }
        } else if (key == KEY_DELETE && gInput.cursorIndex >= 0 && gInput.cursorIndex < theContent.length()) {
			theContent.erase(gInput.cursorIndex, 1);

        } else if (key == KEY_HOME) {
            gInput.cursorIndex = 0;
            gInput.contentStartIndex = 0;

        } else if (key == KEY_END) {
            int aContentLength = (int)theContent.length();
            gInput.contentStartIndex = aContentLength - aCharsFitWidth;
            gInput.contentStartIndex = std::max(gInput.contentStartIndex, 0);

            gInput.cursorIndex = aContentLength - gInput.contentStartIndex;
        }

        return key;
    }